

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

void __thiscall dg::pta::PointerAnalysis::initialize_queue(PointerAnalysis *this)

{
  PSNode *root;
  _Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_28;
  
  root = *(PSNode **)(*(long *)(*(PointerGraph **)(this + 0x38) + 8) + 0x58);
  PointerGraph::getNodes<dg::pta::PSNode*>
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_28,
             *(PointerGraph **)(this + 0x38),&root,true,0);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::_M_move_assign
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)(this + 8),&local_28);
  std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base(&local_28)
  ;
  return;
}

Assistant:

void initialize_queue() {
        assert(to_process.empty());

        PSNode *root = PG->getEntry()->getRoot();
        assert(root && "Do not have root of PG");
        // rely on C++11 move semantics
        to_process = PG->getNodes(root);
    }